

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
sax_parse_internal<nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          (parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *sax)

{
  number_float_t val;
  _Bit_pointer puVar1;
  bool bVar2;
  token_type tVar3;
  number_integer_t val_00;
  number_unsigned_t val_01;
  size_t sVar4;
  string_t *psVar5;
  reference rVar6;
  allocator<char> local_729;
  string local_728;
  string local_708;
  position_t local_6e8;
  parse_error local_6d0;
  string local_6a8;
  position_t local_688;
  allocator<char> local_669;
  string local_668;
  string local_648;
  position_t local_628;
  parse_error local_610;
  string local_5e8;
  position_t local_5c8;
  allocator<char> local_5a9;
  string local_5a8;
  string local_588;
  position_t local_568;
  parse_error local_550;
  string local_528;
  position_t local_508;
  allocator<char> local_4e9;
  string local_4e8;
  string local_4c8;
  position_t local_4a8;
  parse_error local_490;
  string local_468;
  position_t local_448;
  reference local_430;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  position_t local_3d8;
  parse_error local_3c0;
  string local_398;
  position_t local_378;
  allocator<char> local_359;
  string local_358;
  string local_338;
  position_t local_318;
  parse_error local_300;
  string local_2d8;
  position_t local_2b8;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  out_of_range local_240;
  string local_220;
  position_t local_200;
  number_float_t local_1e8;
  number_float_t res;
  string local_1d8;
  string local_1b8;
  position_t local_198;
  parse_error local_180;
  string local_158;
  position_t local_138;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  position_t local_d8;
  parse_error local_c0;
  string local_98;
  position_t local_78;
  undefined4 local_60;
  byte local_49;
  undefined1 local_48 [7];
  bool skip_to_state_evaluation;
  vector<bool,_std::allocator<bool>_> states;
  json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *sax_local;
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)sax;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_48);
  local_49 = 0;
LAB_00198b4b:
  puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  if ((local_49 & 1) != 0) {
    local_49 = 0;
    goto LAB_0019992f;
  }
  switch(*(undefined4 *)(this + 0x20)) {
  case 1:
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::boolean((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,true);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 2:
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::boolean((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,false);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 3:
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::null((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 4:
    psVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(this + 0x28));
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::string((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)puVar1,psVar5);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 5:
    val_01 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get_number_unsigned
                       ((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(this + 0x28));
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::number_unsigned((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)puVar1,val_01);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 6:
    val_00 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get_number_integer
                       ((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(this + 0x28));
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::number_integer((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)puVar1,val_00);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 7:
    local_1e8 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::get_number_float((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)(this + 0x28));
    bVar2 = std::isfinite(local_1e8);
    puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    val = local_1e8;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_position(&local_200,
                     (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(this + 0x28));
      sVar4 = position_t::operator_cast_to_unsigned_long(&local_200);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string(&local_220,
                         (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(this + 0x28));
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string(&local_2a0,
                         (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(this + 0x28));
      std::operator+(&local_280,"number overflow parsing \'",&local_2a0);
      std::operator+(&local_260,&local_280,"\'");
      out_of_range::create(&local_240,0x196,&local_260);
      this_local._7_1_ =
           json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::parse_error<nlohmann::detail::out_of_range>
                     ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)puVar1,sVar4,&local_220,&local_240);
      out_of_range::~out_of_range(&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_220);
LAB_0019a31f:
      local_60 = 1;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      return this_local._7_1_;
    }
    psVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(this + 0x28));
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::number_float((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)puVar1,val,psVar5);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 8:
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::start_array((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage,0xffffffffffffffff);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this);
    if (tVar3 != end_array) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)local_48,true);
      goto LAB_00198b4b;
    }
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::end_array((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_0019a31f;
    }
    break;
  case 9:
    bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::start_object((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage,0xffffffffffffffff);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this);
      puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar3 == end_object) {
        bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::end_object((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        this_local._7_1_ = false;
      }
      else if (*(int *)(this + 0x20) == 4) {
        psVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::get_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(this + 0x28));
        bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::key((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)puVar1,psVar5);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this);
          puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage;
          if (tVar3 == name_separator) goto LAB_00199078;
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::get_position(&local_138,
                         (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(this + 0x28));
          sVar4 = position_t::operator_cast_to_unsigned_long(&local_138);
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::get_token_string(&local_158,
                             (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(this + 0x28));
          lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::get_position(&local_198,
                         (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(this + 0x28));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"object separator",(allocator<char> *)((long)&res + 7));
          parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::exception_message(&local_1b8,
                              (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this,name_separator,&local_1d8);
          parse_error::create(&local_180,0x65,&local_198,&local_1b8);
          this_local._7_1_ =
               json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::parse_error<nlohmann::detail::parse_error>
                         ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)puVar1,sVar4,&local_158,&local_180);
          parse_error::~parse_error(&local_180);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&res + 7));
          std::__cxx11::string::~string((string *)&local_158);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_78,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        sVar4 = position_t::operator_cast_to_unsigned_long(&local_78);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_98,
                           (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this + 0x28));
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_d8,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"object key",&local_119);
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message(&local_f8,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,value_string,&local_118);
        parse_error::create(&local_c0,0x65,&local_d8,&local_f8);
        this_local._7_1_ =
             json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::parse_error<nlohmann::detail::parse_error>
                       ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)puVar1,sVar4,&local_98,&local_c0);
        parse_error::~parse_error(&local_c0);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    else {
      this_local._7_1_ = false;
    }
    goto LAB_0019a31f;
  default:
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_position(&local_378,
                   (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(this + 0x28));
    sVar4 = position_t::operator_cast_to_unsigned_long(&local_378);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string(&local_398,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_position(&local_3d8,
                   (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(this + 0x28));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"value",&local_419);
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::exception_message(&local_3f8,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,literal_or_value,&local_418);
    parse_error::create(&local_3c0,0x65,&local_3d8,&local_3f8);
    this_local._7_1_ =
         json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::parse_error<nlohmann::detail::parse_error>
                   ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)puVar1,sVar4,&local_398,&local_3c0);
    parse_error::~parse_error(&local_3c0);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::__cxx11::string::~string((string *)&local_398);
    goto LAB_0019a31f;
  case 0xe:
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_position(&local_2b8,
                   (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(this + 0x28));
    sVar4 = position_t::operator_cast_to_unsigned_long(&local_2b8);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string(&local_2d8,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_position(&local_318,
                   (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(this + 0x28));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"value",&local_359);
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::exception_message(&local_338,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,uninitialized,&local_358);
    parse_error::create(&local_300,0x65,&local_318,&local_338);
    this_local._7_1_ =
         json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::parse_error<nlohmann::detail::parse_error>
                   ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)puVar1,sVar4,&local_2d8,&local_300);
    parse_error::~parse_error(&local_300);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    std::__cxx11::string::~string((string *)&local_2d8);
    goto LAB_0019a31f;
  }
LAB_0019992f:
  bVar2 = std::vector<bool,_std::allocator<bool>_>::empty
                    ((vector<bool,_std::allocator<bool>_> *)local_48);
  if (bVar2) {
    this_local._7_1_ = true;
    goto LAB_0019a31f;
  }
  rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                    ((vector<bool,_std::allocator<bool>_> *)local_48);
  local_430 = rVar6;
  bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_430);
  if (bVar2) {
    tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this);
    puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    if (tVar3 == value_separator) {
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
    }
    else {
      if (*(int *)(this + 0x20) != 10) {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_448,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        sVar4 = position_t::operator_cast_to_unsigned_long(&local_448);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_468,
                           (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this + 0x28));
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_4a8,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"array",&local_4e9);
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message(&local_4c8,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,end_array,&local_4e8);
        parse_error::create(&local_490,0x65,&local_4a8,&local_4c8);
        this_local._7_1_ =
             json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::parse_error<nlohmann::detail::parse_error>
                       ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)puVar1,sVar4,&local_468,&local_490);
        parse_error::~parse_error(&local_490);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::allocator<char>::~allocator(&local_4e9);
        std::__cxx11::string::~string((string *)&local_468);
        goto LAB_0019a31f;
      }
      bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::end_array((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0019a31f;
      }
      bVar2 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)local_48);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!states.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JonasRock[P]ARXML_LanguageServer/include/extern/json.hpp"
                      ,0x2900,
                      "bool nlohmann::detail::parser<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::sax_parse_internal(SAX *) [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>, SAX = nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>]"
                     );
      }
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      local_49 = 1;
    }
  }
  else {
    tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this);
    puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    if (tVar3 == value_separator) {
      tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this);
      puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar3 != value_string) {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_508,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        sVar4 = position_t::operator_cast_to_unsigned_long(&local_508);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_528,
                           (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this + 0x28));
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_568,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a8,"object key",&local_5a9);
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message(&local_588,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,value_string,&local_5a8);
        parse_error::create(&local_550,0x65,&local_568,&local_588);
        this_local._7_1_ =
             json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::parse_error<nlohmann::detail::parse_error>
                       ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)puVar1,sVar4,&local_528,&local_550);
        parse_error::~parse_error(&local_550);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        std::__cxx11::string::~string((string *)&local_528);
        goto LAB_0019a31f;
      }
      psVar5 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::get_string((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(this + 0x28));
      bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::key((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)puVar1,psVar5);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0019a31f;
      }
      tVar3 = parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this);
      puVar1 = states.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
      if (tVar3 != name_separator) {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_5c8,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        sVar4 = position_t::operator_cast_to_unsigned_long(&local_5c8);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_5e8,
                           (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this + 0x28));
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_628,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"object separator",&local_669);
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message(&local_648,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,name_separator,&local_668);
        parse_error::create(&local_610,0x65,&local_628,&local_648);
        this_local._7_1_ =
             json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::parse_error<nlohmann::detail::parse_error>
                       ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)puVar1,sVar4,&local_5e8,&local_610);
        parse_error::~parse_error(&local_610);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        std::__cxx11::string::~string((string *)&local_5e8);
        goto LAB_0019a31f;
      }
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
    }
    else {
      if (*(int *)(this + 0x20) != 0xb) {
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_688,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        sVar4 = position_t::operator_cast_to_unsigned_long(&local_688);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string(&local_6a8,
                           (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(this + 0x28));
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_position(&local_6e8,
                       (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(this + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"object",&local_729)
        ;
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message(&local_708,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,end_object,&local_728);
        parse_error::create(&local_6d0,0x65,&local_6e8,&local_708);
        this_local._7_1_ =
             json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::parse_error<nlohmann::detail::parse_error>
                       ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)puVar1,sVar4,&local_6a8,&local_6d0);
        parse_error::~parse_error(&local_6d0);
        std::__cxx11::string::~string((string *)&local_708);
        std::__cxx11::string::~string((string *)&local_728);
        std::allocator<char>::~allocator(&local_729);
        std::__cxx11::string::~string((string *)&local_6a8);
        goto LAB_0019a31f;
      }
      bVar2 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::end_object((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)states.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0019a31f;
      }
      bVar2 = std::vector<bool,_std::allocator<bool>_>::empty
                        ((vector<bool,_std::allocator<bool>_> *)local_48);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!states.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JonasRock[P]ARXML_LanguageServer/include/extern/json.hpp"
                      ,0x2938,
                      "bool nlohmann::detail::parser<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::sax_parse_internal(SAX *) [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>, SAX = nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>]"
                     );
      }
      std::vector<bool,_std::allocator<bool>_>::pop_back
                ((vector<bool,_std::allocator<bool>_> *)local_48);
      local_49 = 1;
    }
  }
  goto LAB_00198b4b;
LAB_00199078:
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)local_48,false);
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::get_token((parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this);
  goto LAB_00198b4b;
}

Assistant:

bool sax_parse_internal(SAX* sax)
    {
        // stack to remember the hierarchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (!skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->start_object(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_HEDLEY_UNLIKELY(!sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_HEDLEY_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::value_string, "object key")));
                        }
                        if (JSON_HEDLEY_UNLIKELY(!sax->key(m_lexer.get_string())))
                        {
                            return false;
                        }

                        // parse separator (:)
                        if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::name_separator, "object separator")));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->start_array(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_HEDLEY_UNLIKELY(!sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_HEDLEY_UNLIKELY(!std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }

                        if (JSON_HEDLEY_UNLIKELY(!sax->number_float(res, m_lexer.get_string())))
                        {
                            return false;
                        }

                        break;
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_HEDLEY_UNLIKELY(!sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::uninitialized, "value")));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::literal_or_value, "value")));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hierarchy: done
                return true;
            }

            if (states.back())  // array
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse a new value
                    get_token();
                    continue;
                }

                // closing ]
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_array))
                {
                    if (JSON_HEDLEY_UNLIKELY(!sax->end_array()))
                    {
                        return false;
                    }

                    // We are done with this array. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    JSON_ASSERT(!states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_array, "array")));
            }
            else  // object
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse key
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::value_string))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::value_string, "object key")));
                    }

                    if (JSON_HEDLEY_UNLIKELY(!sax->key(m_lexer.get_string())))
                    {
                        return false;
                    }

                    // parse separator (:)
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::name_separator, "object separator")));
                    }

                    // parse values
                    get_token();
                    continue;
                }

                // closing }
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_object))
                {
                    if (JSON_HEDLEY_UNLIKELY(!sax->end_object()))
                    {
                        return false;
                    }

                    // We are done with this object. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    JSON_ASSERT(!states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_object, "object")));
            }
        }
    }